

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

void __thiscall
mjs::anon_unknown_46::stringify_state::stringify_state
          (stringify_state *this,gc_heap_ptr<mjs::global_object> *global,
          vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  int iVar1;
  stringify_state *h_00;
  bool bVar2;
  value_type vVar3;
  uint32_t uVar4;
  size_type sVar5;
  const_reference pvVar6;
  object *poVar7;
  object_ptr *poVar8;
  gc_heap *h_01;
  int *piVar9;
  string *psVar10;
  unsigned_long *puVar11;
  uint32_t index;
  mjs *this_00;
  double dVar12;
  undefined1 auVar13 [16];
  wstring_view wVar14;
  bool local_379;
  size_type local_2e0;
  unsigned_long local_2d8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_2d0;
  undefined1 local_2c0 [8];
  wstring_view s;
  int local_2a8;
  int local_2a4;
  wstring local_2a0 [32];
  string local_280;
  value local_270;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_248;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_238;
  value local_228;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_200;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_1f0;
  undefined1 local_1e0 [8];
  string class_name;
  object_ptr o_1;
  value_type space;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_188;
  byte local_171;
  undefined1 local_170 [24];
  wchar_t *local_158;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> local_150;
  undefined1 local_140 [24];
  wchar_t *local_128;
  undefined1 local_120 [8];
  object_ptr io;
  wstring local_100;
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  value item;
  undefined1 auStack_a0 [4];
  uint32_t i;
  anon_class_16_2_fd512dd5 insert_item;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_80;
  value local_70;
  uint32_t local_44;
  stringify_state *psStack_40;
  uint32_t len;
  gc_heap *h;
  object_ptr *o;
  vector<mjs::value,_std::allocator<mjs::value>_> *local_20;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  stringify_state *this_local;
  
  local_20 = args;
  args_local = (vector<mjs::value,_std::allocator<mjs::value>_> *)global;
  global_local = &this->global_;
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&this->global_,global);
  gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_true>_>_>::gc_heap_ptr
            (&this->stack_,(nullptr_t)0x0);
  gc_heap_ptr<mjs::object>::gc_heap_ptr(&this->replacer_,(nullptr_t)0x0);
  gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>::gc_heap_ptr
            (&this->property_names_,(nullptr_t)0x0);
  std::__cxx11::wstring::wstring((wstring *)&this->indent_);
  std::__cxx11::wstring::wstring((wstring *)&this->gap_);
  bVar2 = std::vector<mjs::value,_std::allocator<mjs::value>_>::empty(local_20);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    sVar5 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(local_20);
    if (1 < sVar5) {
      pvVar6 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](local_20,1);
      vVar3 = value::type(pvVar6);
      if (vVar3 == object) {
        pvVar6 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](local_20,1);
        h = (gc_heap *)value::object_value(pvVar6);
        bVar2 = gc_heap_ptr_untyped::has_type<mjs::function_object>((gc_heap_ptr_untyped *)h);
        if (bVar2) {
          gc_heap_ptr<mjs::object>::operator=(&this->replacer_,(gc_heap_ptr<mjs::object> *)h);
        }
        else {
          bVar2 = is_array((object_ptr *)h);
          if (bVar2) {
            psStack_40 = (stringify_state *)heap(this);
            poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)h);
            std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                      (&local_80,L"length");
            (**poVar7->_vptr_object)(&local_70,poVar7,&local_80);
            uVar4 = to_uint32(&local_70);
            value::~value(&local_70);
            local_44 = uVar4;
            gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>::make
                      ((gc_heap *)&insert_item.h,(uint32_t)psStack_40);
            gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>::
            operator=(&this->property_names_,
                      (gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>
                       *)&insert_item.h);
            gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>::
            ~gc_heap_ptr((gc_heap_ptr<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::gc_string,_true>_>_>
                          *)&insert_item.h);
            insert_item.this = psStack_40;
            _auStack_a0 = this;
            for (item.field_1._28_4_ = 0; item.field_1._28_4_ < local_44;
                item.field_1._28_4_ = item.field_1._28_4_ + 1) {
              poVar7 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)h);
              index_string_abi_cxx11_(&local_100,(mjs *)(ulong)(uint)item.field_1._28_4_,index);
              auVar13 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                                  ((wstring *)&local_100);
              local_e0 = auVar13;
              (**poVar7->_vptr_object)(local_d0,poVar7,local_e0);
              std::__cxx11::wstring::~wstring((wstring *)&local_100);
              vVar3 = value::type((value *)local_d0);
              if (vVar3 == string) {
                psVar10 = value::string_value((value *)local_d0);
                stringify_state::anon_class_16_2_fd512dd5::operator()
                          ((anon_class_16_2_fd512dd5 *)auStack_a0,psVar10);
              }
              else {
                vVar3 = value::type((value *)local_d0);
                h_00 = psStack_40;
                if (vVar3 == number) {
                  dVar12 = value::number_value((value *)local_d0);
                  to_string((mjs *)&io.super_gc_heap_ptr_untyped.pos_,(gc_heap *)h_00,dVar12);
                  stringify_state::anon_class_16_2_fd512dd5::operator()
                            ((anon_class_16_2_fd512dd5 *)auStack_a0,
                             (string *)&io.super_gc_heap_ptr_untyped.pos_);
                  string::~string((string *)&io.super_gc_heap_ptr_untyped.pos_);
                }
                else {
                  vVar3 = value::type((value *)local_d0);
                  if (vVar3 == object) {
                    poVar8 = value::object_value((value *)local_d0);
                    gc_heap_ptr<mjs::object>::gc_heap_ptr
                              ((gc_heap_ptr<mjs::object> *)local_120,poVar8);
                    local_171 = 0;
                    gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_120);
                    object::class_name((object *)local_140);
                    wVar14 = string::view((string *)local_140);
                    unique0x10001690 = wVar14;
                    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                              (&local_150,L"String");
                    bVar2 = std::operator==(stack0xfffffffffffffed0,local_150);
                    local_379 = true;
                    if (!bVar2) {
                      gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_120);
                      object::class_name((object *)local_170);
                      local_171 = 1;
                      wVar14 = string::view((string *)local_170);
                      unique0x100016a0 = wVar14;
                      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                                (&local_188,L"Number");
                      local_379 = std::operator==(stack0xfffffffffffffea0,local_188);
                    }
                    if ((local_171 & 1) != 0) {
                      string::~string((string *)local_170);
                    }
                    string::~string((string *)local_140);
                    if (local_379 != false) {
                      to_string((mjs *)&space.field_1.r_.property_name_.
                                        super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                                        pos_,(gc_heap *)psStack_40,(value *)local_d0);
                      stringify_state::anon_class_16_2_fd512dd5::operator()
                                ((anon_class_16_2_fd512dd5 *)auStack_a0,
                                 (string *)
                                 &space.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                                  super_gc_heap_ptr_untyped.pos_);
                      string::~string((string *)
                                      &space.field_1.r_.property_name_.
                                       super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                                       pos_);
                    }
                    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_120);
                  }
                }
              }
              value::~value((value *)local_d0);
            }
          }
        }
      }
    }
    sVar5 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(local_20);
    if (2 < sVar5) {
      pvVar6 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](local_20,2);
      value::value((value *)&o_1.super_gc_heap_ptr_untyped.pos_,pvVar6);
      vVar3 = value::type((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
      if (vVar3 == object) {
        poVar8 = value::object_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
        gc_heap_ptr<mjs::object>::gc_heap_ptr
                  ((gc_heap_ptr<mjs::object> *)
                   &class_name.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
                   poVar8);
        gc_heap_ptr<mjs::object>::operator->
                  ((gc_heap_ptr<mjs::object> *)
                   &class_name.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
        object::class_name((object *)local_1e0);
        local_1f0 = string::view((string *)local_1e0);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_200,L"Number");
        bVar2 = std::operator==(local_1f0,local_200);
        if (bVar2) {
          dVar12 = to_number((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
          value::value(&local_228,dVar12);
          value::operator=((value *)&o_1.super_gc_heap_ptr_untyped.pos_,&local_228);
          value::~value(&local_228);
        }
        else {
          local_238 = string::view((string *)local_1e0);
          std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                    (&local_248,L"String");
          bVar2 = std::operator==(local_238,local_248);
          if (bVar2) {
            h_01 = heap(this);
            to_string((mjs *)&local_280,h_01,(value *)&o_1.super_gc_heap_ptr_untyped.pos_);
            value::value(&local_270,&local_280);
            value::operator=((value *)&o_1.super_gc_heap_ptr_untyped.pos_,&local_270);
            value::~value(&local_270);
            string::~string(&local_280);
          }
        }
        string::~string((string *)local_1e0);
        gc_heap_ptr<mjs::object>::~gc_heap_ptr
                  ((gc_heap_ptr<mjs::object> *)
                   &class_name.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
      }
      vVar3 = value::type((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
      if (vVar3 == number) {
        local_2a4 = 0;
        local_2a8 = 10;
        this_00 = (mjs *)&o_1.super_gc_heap_ptr_untyped.pos_;
        dVar12 = value::number_value((value *)this_00);
        dVar12 = to_integer(this_00,dVar12);
        s._M_str._4_4_ = (int)dVar12;
        piVar9 = std::min<int>(&stack0xfffffffffffffd58,(int *)((long)&s._M_str + 4));
        piVar9 = std::max<int>(&stack0xfffffffffffffd5c,piVar9);
        iVar1 = *piVar9;
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  (local_2a0,(long)iVar1,L' ',(allocator<wchar_t> *)((long)&s._M_str + 3));
        std::__cxx11::wstring::operator=((wstring *)&this->gap_,local_2a0);
        std::__cxx11::wstring::~wstring(local_2a0);
        std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&s._M_str + 3));
      }
      else {
        vVar3 = value::type((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
        if (vVar3 == string) {
          psVar10 = value::string_value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
          wVar14 = string::view(psVar10);
          s._M_len = (size_t)wVar14._M_str;
          local_2c0 = (undefined1  [8])wVar14._M_len;
          local_2d8 = 10;
          local_2e0 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length
                                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_2c0
                                );
          puVar11 = std::min<unsigned_long>(&local_2d8,&local_2e0);
          local_2d0 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_2c0
                                 ,0,*puVar11);
          std::__cxx11::wstring::operator=((wstring *)&this->gap_,&local_2d0);
        }
      }
      value::~value((value *)&o_1.super_gc_heap_ptr_untyped.pos_);
    }
    return;
  }
  __assert_fail("!args.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                ,0x1c9,
                "mjs::(anonymous namespace)::stringify_state::stringify_state(const gc_heap_ptr<global_object> &, const std::vector<value> &)"
               );
}

Assistant:

explicit stringify_state(const gc_heap_ptr<global_object>& global, const std::vector<value>& args) : global_(global) {
        assert(!args.empty());
        if (args.size() > 1 && args[1].type() == value_type::object) {
            const auto& o = args[1].object_value();
            if (o.has_type<function_object>()) {
                replacer_ = o;
            } else if (is_array(o)) {
                auto& h = heap();
                const uint32_t len = to_uint32(o->get(L"length"));
                property_names_ = gc_vector<gc_heap_ptr_untracked<gc_string>>::make(h, len);
                auto insert_item = [&](const string& item) {
                    // Check if the item is already in the list
                    auto n = property_names_->data();
                    for (uint32_t i = 0, l = property_names_->length(); i < l; ++i) {
                        if (n[i].dereference(h).view() == item.view()) {
                            return;
                        }
                    }
                    property_names_->push_back(item.unsafe_raw_get());
                };
                for (uint32_t i = 0; i < len; ++i) {
                    auto item = o->get(index_string(i));
                    if (item.type() == value_type::string) {
                        insert_item(item.string_value());
                    } else if (item.type() == value_type::number) {
                        insert_item(to_string(h, item.number_value()));
                    } else if (item.type() == value_type::object) {
                        auto io = item.object_value();
                        if (io->class_name().view() == L"String" || io->class_name().view() == L"Number") {
                            insert_item(to_string(h, item));
                        }
                    }
                }
            }
        }
        if (args.size() > 2) {
            auto space = args[2];
            if (space.type() == value_type::object) {
                // FIXME: As below this is a bad way to determine the type...
                auto o = space.object_value();
                const auto class_name = o->class_name();
                if (class_name.view() == L"Number") {
                    space = value{to_number(space)};
                } else if (class_name.view() == L"String") {
                    space = value{to_string(heap(), space)};
                }
            }

            if (space.type() == value_type::number) {
                gap_ = std::wstring(std::max(0, std::min(10, static_cast<int>(to_integer(space.number_value())))), ' ');
            } else if (space.type() == value_type::string) {
                auto s = space.string_value().view(); 
                gap_ = s.substr(0, std::min(size_t{10}, s.length()));
            }
        }
    }